

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgemm.hpp
# Opt level: O1

void remora::bindings::ugemm<remora::bindings::syrk_block_size<double>,double,double>
               (size_t kc,double alpha,double *A,double *B,double *C,size_t stride1,size_t stride2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  size_t sVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  undefined1 *puVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  type Pa;
  undefined1 auStack_1c0 [40];
  size_t local_198;
  double local_190;
  undefined1 local_180 [336];
  
  puVar5 = auStack_1c0;
  puVar6 = auStack_1c0;
  local_198 = stride1;
  local_190 = alpha;
  memset(local_180,0,0x100);
  if (kc != 0) {
    sVar4 = 0;
    do {
      lVar8 = 0;
      puVar7 = local_180;
      do {
        dVar1 = A[lVar8];
        lVar10 = 0;
        do {
          dVar3 = (B + lVar10)[1];
          dVar2 = *(double *)((long)(puVar7 + lVar10 * 8) + 8);
          *(double *)(puVar7 + lVar10 * 8) = B[lVar10] * dVar1 + *(double *)(puVar7 + lVar10 * 8);
          *(double *)((long)(puVar7 + lVar10 * 8) + 8) = dVar3 * dVar1 + dVar2;
          lVar10 = lVar10 + 2;
        } while (lVar10 != 8);
        lVar8 = lVar8 + 1;
        puVar7 = puVar7 + 0x40;
      } while (lVar8 != 4);
      A = A + 4;
      B = B + 8;
      sVar4 = sVar4 + 1;
    } while (sVar4 != kc);
  }
  if ((local_190 != 1.0) || (NAN(local_190))) {
    lVar8 = 0;
    do {
      puVar5 = puVar5 + 0x40;
      lVar10 = 0;
      do {
        dVar1 = *(double *)((long)(puVar5 + lVar10 * 8) + 8);
        *(double *)(puVar5 + lVar10 * 8) = *(double *)(puVar5 + lVar10 * 8) * local_190;
        *(double *)((long)(puVar5 + lVar10 * 8) + 8) = dVar1 * local_190;
        lVar10 = lVar10 + 2;
      } while (lVar10 != 8);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
  }
  lVar8 = 0;
  do {
    puVar6 = puVar6 + 0x40;
    lVar10 = 0;
    pdVar9 = C;
    do {
      *pdVar9 = *(double *)(puVar6 + lVar10 * 8) + *pdVar9;
      lVar10 = lVar10 + 1;
      pdVar9 = pdVar9 + stride2;
    } while (lVar10 != 8);
    lVar8 = lVar8 + 1;
    C = C + local_198;
  } while (lVar8 != 4);
  return;
}

Assistant:

void ugemm(
	std::size_t kc, TC alpha, T const* A, T const* B,
	TC* C, std::size_t stride1, std::size_t stride2
){
	BOOST_ALIGN_ASSUME_ALIGNED(A, block_size::block::align);
	BOOST_ALIGN_ASSUME_ALIGNED(B, block_size::block::align);

	typedef typename block_size::block::type vx;
	static const std::size_t vector_length = block_size::block::vector_elements;
	static const std::size_t vecNR = block_size::nr/vector_length;
#ifdef REMORA_USE_SIMD
	vx P[block_size::mr * vecNR] = {};
#else
	typename std::aligned_storage<sizeof(vx[block_size::mr*vecNR]),block_size::block::align>::type Pa;
	T* P = reinterpret_cast<T*>(&Pa);
	for (std::size_t c = 0; c < block_size::mr*vecNR; c++)
		P[c] = 0;
#endif


	// perform the matrix-matrix product as outer product
	// of rows of A and B
	vx const* b = (vx const*)B;
	for (std::size_t l=0; l<kc; ++l) {
		for (std::size_t i=0; i<block_size::mr; ++i) {
			for (std::size_t j=0; j<vecNR; ++j) {
				P[i * vecNR+j] += A[i]*b[j];
			}
		}
		A += block_size::mr;
		b += vecNR;
	}
	//multiply with alpha if necessary
	if (alpha!=TC(1)) {
		for (std::size_t i=0; i<block_size::mr; ++i) {
			for (std::size_t j=0; j< vecNR; ++j) {
				P[i*vecNR+j] *= alpha;
			}
		}
	}

	//add result to C
	T const* p = (T const*) P;
	for (std::size_t i=0; i<block_size::mr; ++i) {
		for (std::size_t j=0; j<block_size::nr; ++j) {
			C[i * stride1+j * stride2] += p[i*block_size::nr+j];
		}
	}
}